

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

int AF_AActor_A_SkullPop
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  player_t *ppVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined4 extraout_var;
  VMValue *pVVar7;
  PClass *pPVar8;
  PClassPlayerPawn *type;
  APlayerPawn *this;
  long *plVar9;
  long lVar10;
  PClassPlayerPawn *pPVar11;
  AActor *other;
  AActor *pAVar12;
  char *pcVar13;
  bool bVar14;
  DVector3 local_48;
  PClass *pPVar6;
  
  pPVar8 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar13 = "(paramnum) < numparam";
    goto LAB_0046c4dd;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0046c4cd:
    pcVar13 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0046c4dd:
    __assert_fail(pcVar13,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                  ,0x68d,
                  "int AF_AActor_A_SkullPop(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  other = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (other == (AActor *)0x0) goto LAB_0046c2a4;
    pPVar6 = (other->super_DThinker).super_DObject.Class;
    if (pPVar6 == (PClass *)0x0) {
      iVar3 = (**(other->super_DThinker).super_DObject._vptr_DObject)(other);
      pPVar6 = (PClass *)CONCAT44(extraout_var,iVar3);
      (other->super_DThinker).super_DObject.Class = pPVar6;
    }
    bVar14 = pPVar6 != (PClass *)0x0;
    if (pPVar6 != pPVar8 && bVar14) {
      do {
        pPVar6 = pPVar6->ParentClass;
        bVar14 = pPVar6 != (PClass *)0x0;
        if (pPVar6 == pPVar8) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    if (!bVar14) {
      pcVar13 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0046c4dd;
    }
  }
  else {
    if (other != (AActor *)0x0) goto LAB_0046c4cd;
LAB_0046c2a4:
    other = (AActor *)0x0;
  }
  if (numparam != 1) {
    if (param[1].field_0.field_3.Type == '\x03') {
      pVVar7 = param + 1;
      if (param[1].field_0.field_1.atag == 1) goto LAB_0046c2e6;
      if ((pVVar7->field_0).field_1.a == (void *)0x0) goto LAB_0046c31f;
    }
    pcVar13 = 
    "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
    ;
    goto LAB_0046c4fc;
  }
  pVVar1 = defaultparam->Array;
  if (pVVar1[1].field_0.field_3.Type == '\x03') {
    pVVar7 = pVVar1 + 1;
    if (pVVar1[1].field_0.field_1.atag == 1) {
LAB_0046c2e6:
      type = (PClassPlayerPawn *)(pVVar7->field_0).field_1.a;
      if (type != (PClassPlayerPawn *)0x0) {
        pPVar11 = type;
        if (type == (PClassPlayerPawn *)APlayerChunk::RegistrationInfo.MyClass) goto LAB_0046c352;
        do {
          pPVar11 = (PClassPlayerPawn *)(pPVar11->super_PClassActor).super_PClass.ParentClass;
          if (pPVar11 == (PClassPlayerPawn *)APlayerChunk::RegistrationInfo.MyClass) break;
        } while (pPVar11 != (PClassPlayerPawn *)0x0);
        if (pPVar11 != (PClassPlayerPawn *)0x0) goto LAB_0046c352;
      }
    }
    else if ((pVVar7->field_0).field_1.a != (void *)0x0) goto LAB_0046c2c4;
LAB_0046c31f:
    iVar3 = FName::NameManager::FindName(&FName::NameData,"BloodySkull",true);
    local_48.X = (double)CONCAT44(local_48.X._4_4_,iVar3);
    pPVar8 = PClass::FindClass((FName *)&local_48);
    type = dyn_cast<PClassPlayerPawn>((DObject *)pPVar8);
    if (type == (PClassPlayerPawn *)0x0) {
      return 0;
    }
LAB_0046c352:
    *(byte *)&(other->flags).Value = (byte)(other->flags).Value & 0xfd;
    local_48.Z = (other->__Pos).Z + 48.0;
    local_48.X = (other->__Pos).X;
    local_48.Y = (other->__Pos).Y;
    this = (APlayerPawn *)AActor::StaticSpawn(&type->super_PClassActor,&local_48,NO_REPLACE,false);
    uVar4 = FRandom::GenRand32(&pr_skullpop);
    uVar5 = FRandom::GenRand32(&pr_skullpop);
    ((DVector3 *)((DRotator *)(&(this->super_AActor).super_DThinker + 3) + 1))->X =
         (double)(int)((uVar4 & 0xff) - (uVar5 & 0xff)) * 0.0078125;
    uVar4 = FRandom::GenRand32(&pr_skullpop);
    uVar5 = FRandom::GenRand32(&pr_skullpop);
    ((DVector3 *)((DRotator *)(&(this->super_AActor).super_DThinker + 3) + 1))->Y =
         (double)(int)((uVar4 & 0xff) - (uVar5 & 0xff)) * 0.0078125;
    uVar4 = FRandom::GenRand32(&pr_skullpop);
    ((DVector3 *)((DRotator *)(&(this->super_AActor).super_DThinker + 3) + 1))->Z =
         (double)(uVar4 & 0xff) * 0.0009765625 + 2.0;
    ppVar2 = other->player;
    other->player = (player_t *)0x0;
    AActor::ObtainInventory((AActor *)this,other);
    *(player_t **)(&(this->super_AActor).super_DThinker + 10) = ppVar2;
    (this->super_AActor).health = other->health;
    (this->super_AActor).Angles.Yaw.Degrees = (other->Angles).Yaw.Degrees;
    if (ppVar2 != (player_t *)0x0) {
      ppVar2->mo = this;
      ppVar2->damagecount = 0x20;
    }
    plVar9 = &DAT_017e1fb8;
    lVar10 = 0;
    do {
      if (playeringame[lVar10] == true) {
        pAVar12 = (AActor *)*plVar9;
        if (pAVar12 == (AActor *)0x0) {
LAB_0046c4a5:
          pAVar12 = (AActor *)0x0;
        }
        else if (((pAVar12->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          *plVar9 = 0;
          goto LAB_0046c4a5;
        }
        if (pAVar12 == other) {
          *plVar9 = (long)this;
        }
      }
      lVar10 = lVar10 + 1;
      plVar9 = plVar9 + 0x54;
      if (lVar10 == 8) {
        return 0;
      }
    } while( true );
  }
LAB_0046c2c4:
  pcVar13 = 
  "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
  ;
LAB_0046c4fc:
  __assert_fail(pcVar13,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                ,0x68e,
                "int AF_AActor_A_SkullPop(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SkullPop)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS_DEF(spawntype, APlayerChunk);

	APlayerPawn *mo;
	player_t *player;

	// [GRB] Parameterized version
	if (spawntype == NULL || !spawntype->IsDescendantOf(RUNTIME_CLASS(APlayerChunk)))
	{
		spawntype = dyn_cast<PClassPlayerPawn>(PClass::FindClass("BloodySkull"));
		if (spawntype == NULL)
			return 0;
	}

	self->flags &= ~MF_SOLID;
	mo = (APlayerPawn *)Spawn (spawntype, self->PosPlusZ(48.), NO_REPLACE);
	//mo->target = self;
	mo->Vel.X = pr_skullpop.Random2() / 128.;
	mo->Vel.Y = pr_skullpop.Random2() / 128.;
	mo->Vel.Z = 2. + (pr_skullpop() / 1024.);
	// Attach player mobj to bloody skull
	player = self->player;
	self->player = NULL;
	mo->ObtainInventory (self);
	mo->player = player;
	mo->health = self->health;
	mo->Angles.Yaw = self->Angles.Yaw;
	if (player != NULL)
	{
		player->mo = mo;
		player->damagecount = 32;
	}
	for (int i = 0; i < MAXPLAYERS; ++i)
	{
		if (playeringame[i] && players[i].camera == self)
		{
			players[i].camera = mo;
		}
	}
	return 0;
}